

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_RCX;
  int in_EDX;
  RtreeCell *in_RSI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  RtreeDValue RVar4;
  RtreeDValue area_1;
  RtreeDValue growth;
  RtreeDValue area;
  int nCell;
  RtreeDValue fMinArea;
  RtreeDValue fMinGrowth;
  int bFound;
  sqlite3_int64 iBest;
  int iCell;
  int ii;
  int rc;
  RtreeNode *pChild;
  RtreeNode *pNode;
  RtreeCell cell_1;
  RtreeCell cell;
  RtreeNode *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  RtreeCell *in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  RtreeCell *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  RtreeNode *in_stack_ffffffffffffff38;
  RtreeCell *pParent;
  i64 in_stack_ffffffffffffff40;
  double iNode;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar5;
  int local_a4;
  int local_a0;
  int local_9c;
  RtreeCell local_68;
  RtreeCell local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9c = nodeAcquire((Rtree *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         (RtreeNode **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                        );
  local_a0 = 0;
  do {
    uVar1 = in_stack_ffffffffffffff14 & 0xffffff;
    if (local_9c == 0) {
      uVar1 = CONCAT13(local_a0 < in_RDI->iDepth - in_EDX,(int3)in_stack_ffffffffffffff14);
    }
    in_stack_ffffffffffffff14 = uVar1;
    if ((char)(in_stack_ffffffffffffff14 >> 0x18) == '\0') {
      *in_RCX = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_9c;
    }
    iVar5 = 0;
    iNode = 0.0;
    pParent = (RtreeCell *)0x0;
    iVar2 = readInt16((u8 *)(lRam0000000000000018 + 2));
    for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
      memcpy(&local_38,&DAT_002b1068,0x30);
      nodeGetCell((Rtree *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
                  (RtreeNode *)in_stack_ffffffffffffff28,
                  (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
      iVar3 = cellContains(in_RDI,&local_38,in_RSI);
      if ((iVar3 != 0) &&
         ((in_stack_ffffffffffffff28 = (RtreeCell *)cellArea(in_RDI,&local_38), iVar5 == 0 ||
          ((double)in_stack_ffffffffffffff28 < (double)pParent)))) {
        iVar5 = 1;
        pParent = in_stack_ffffffffffffff28;
      }
    }
    if (iVar5 == 0) {
      for (local_a4 = 0; local_a4 < iVar2; local_a4 = local_a4 + 1) {
        memcpy(&local_68,&DAT_002b1098,0x30);
        nodeGetCell((Rtree *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
                    (RtreeNode *)in_stack_ffffffffffffff28,-1,(RtreeCell *)0xffffffffffffffff);
        in_stack_ffffffffffffff18 = (RtreeCell *)cellArea(in_RDI,&local_68);
        cellUnion(in_RDI,&local_68,in_RSI);
        RVar4 = cellArea(in_RDI,&local_68);
        in_stack_ffffffffffffff20 = RVar4 - (double)in_stack_ffffffffffffff18;
        if ((local_a4 == 0) || (in_stack_ffffffffffffff20 < iNode)) {
LAB_0029cacc:
          pParent = in_stack_ffffffffffffff18;
          iNode = in_stack_ffffffffffffff20;
        }
        else if ((in_stack_ffffffffffffff20 == iNode) &&
                ((!NAN(in_stack_ffffffffffffff20) && !NAN(iNode) &&
                 ((double)in_stack_ffffffffffffff18 < (double)pParent)))) goto LAB_0029cacc;
      }
    }
    local_9c = nodeAcquire((Rtree *)CONCAT44(iVar5,in_stack_ffffffffffffff48),(i64)iNode,
                           (RtreeNode *)pParent,
                           (RtreeNode **)CONCAT44(iVar2,in_stack_ffffffffffffff30));
    nodeRelease((Rtree *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                in_stack_ffffffffffffff08);
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;
    int bFound = 0;
    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;
    int nCell = NCELL(pNode);
    RtreeNode *pChild = 0;

    /* First check to see if there is are any cells in pNode that completely
    ** contains pCell.  If two or more cells in pNode completely contain pCell
    ** then pick the smallest.
    */
    for(iCell=0; iCell<nCell; iCell++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      if( cellContains(pRtree, &cell, pCell) ){
        RtreeDValue area = cellArea(pRtree, &cell);
        if( bFound==0 || area<fMinArea ){
          iBest = cell.iRowid;
          fMinArea = area;
          bFound = 1;
        }
      }
    }
    if( !bFound ){
      /* No cells of pNode will completely contain pCell.  So pick the
      ** cell of pNode that grows by the least amount when pCell is added.
      ** Break ties by selecting the smaller cell.
      */
      for(iCell=0; iCell<nCell; iCell++){
        RtreeCell cell;
        RtreeDValue growth;
        RtreeDValue area;
        nodeGetCell(pRtree, pNode, iCell, &cell);
        area = cellArea(pRtree, &cell);
        cellUnion(pRtree, &cell, pCell);
        growth = cellArea(pRtree, &cell)-area;
        if( iCell==0
         || growth<fMinGrowth
         || (growth==fMinGrowth && area<fMinArea)
        ){
          fMinGrowth = growth;
          fMinArea = area;
          iBest = cell.iRowid;
        }
      }
    }

    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}